

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O0

void __thiscall
Diligent::DynamicDescriptorSetAllocator::ReleasePools
          (DynamicDescriptorSetAllocator *this,Uint64 QueueMask)

{
  bool bVar1;
  unsigned_long *puVar2;
  size_type local_40;
  reference local_38;
  DescriptorPoolWrapper *Pool;
  iterator __end1;
  iterator __begin1;
  vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  *__range1;
  Uint64 QueueMask_local;
  DynamicDescriptorSetAllocator *this_local;
  
  __end1 = std::
           vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
           ::begin(&this->m_AllocatedPools);
  Pool = (DescriptorPoolWrapper *)
         std::
         vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
         ::end(&this->m_AllocatedPools);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_*,_std::vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>_>
                                *)&Pool);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_*,_std::vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>_>
               ::operator*(&__end1);
    DescriptorPoolManager::DisposePool(this->m_GlobalPoolMgr,local_38,QueueMask);
    __gnu_cxx::
    __normal_iterator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_*,_std::vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>_>
    ::operator++(&__end1);
  }
  local_40 = std::
             vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
             ::size(&this->m_AllocatedPools);
  puVar2 = std::max<unsigned_long>(&this->m_PeakPoolCount,&local_40);
  this->m_PeakPoolCount = *puVar2;
  std::
  vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ::clear(&this->m_AllocatedPools);
  return;
}

Assistant:

void DynamicDescriptorSetAllocator::ReleasePools(Uint64 QueueMask)
{
    for (VulkanUtilities::DescriptorPoolWrapper& Pool : m_AllocatedPools)
    {
        m_GlobalPoolMgr.DisposePool(std::move(Pool), QueueMask);
    }
    m_PeakPoolCount = std::max(m_PeakPoolCount, m_AllocatedPools.size());
    m_AllocatedPools.clear();
}